

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O1

void ur_kinematics::forward(double *q,double *T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = sin(*q);
  dVar2 = cos(*q);
  dVar7 = q[1];
  dVar3 = sin(dVar7);
  dVar4 = cos(q[1]);
  dVar5 = sin(q[2]);
  dVar6 = cos(q[2]);
  dVar12 = dVar7 + q[2] + q[3];
  dVar7 = sin(q[4]);
  dVar8 = cos(q[4]);
  dVar9 = sin(q[5]);
  dVar10 = cos(q[5]);
  dVar11 = sin(dVar12);
  dVar12 = cos(dVar12);
  dVar15 = dVar2 * dVar12 - dVar1 * dVar11;
  dVar14 = dVar2 * dVar12 + dVar1 * dVar11;
  *T = dVar7 * dVar14 * 0.5 + (dVar7 * dVar15 * 0.5 - dVar8 * dVar1);
  dVar13 = dVar8 * dVar14 * 0.5 + dVar1 * dVar7 + dVar8 * dVar15 * 0.5;
  dVar17 = dVar1 * dVar12 + dVar2 * dVar11;
  dVar16 = dVar1 * dVar12 - dVar2 * dVar11;
  T[1] = dVar10 * dVar13 + dVar9 * (dVar17 - dVar16) * -0.5;
  T[2] = (dVar17 - dVar16) * dVar10 * -0.5 - dVar13 * dVar9;
  T[3] = dVar2 * -0.2132 * dVar3 * dVar5 +
         ((dVar8 * -0.0921 * dVar1 +
          dVar2 * 0.24355 * dVar4 +
          dVar14 * 0.0921 * dVar7 * 0.5 +
          dVar15 * 0.0921 * dVar7 * 0.5 +
          dVar1 * -0.13105 + dVar17 * -0.08535 * 0.5 + dVar16 * 0.08535 * 0.5) -
         dVar4 * dVar2 * -0.2132 * dVar6);
  T[4] = dVar7 * dVar16 * 0.5 + dVar2 * dVar8 + dVar7 * dVar17 * 0.5;
  dVar13 = dVar8 * dVar16 * 0.5 + (dVar8 * dVar17 * 0.5 - dVar2 * dVar7);
  dVar18 = dVar14 * -0.5 + dVar15 * 0.5;
  T[5] = dVar10 * dVar13 + dVar9 * dVar18;
  T[6] = dVar18 * dVar10 - dVar13 * dVar9;
  T[7] = dVar1 * -0.2132 * dVar3 * dVar5 +
         dVar4 * 0.2132 * dVar6 * dVar1 +
         dVar4 * 0.24355 * dVar1 +
         dVar2 * 0.0921 * dVar8 +
         dVar16 * 0.0921 * dVar7 * 0.5 +
         dVar17 * 0.0921 * dVar7 * 0.5 +
         dVar2 * 0.13105 + dVar14 * -0.08535 * 0.5 + dVar15 * 0.08535 * 0.5;
  dVar1 = dVar12 * dVar8 - dVar7 * dVar11;
  dVar7 = dVar12 * dVar8 + dVar7 * dVar11;
  T[8] = dVar7 * -0.5 + dVar1 * 0.5;
  T[9] = ((dVar11 * dVar10 + dVar9 * dVar12) * -0.5 + (dVar11 * dVar10 - dVar9 * dVar12) * 0.5) -
         dVar8 * dVar11 * dVar10;
  T[10] = (dVar10 * dVar12 - dVar11 * dVar9) * -0.5 +
          dVar8 * dVar11 * dVar9 + (dVar10 * dVar12 + dVar11 * dVar9) * -0.5;
  T[0xb] = dVar12 * -0.08535 +
           dVar7 * -0.0921 * 0.5 +
           dVar3 * -0.24355 +
           (dVar6 * dVar3 + dVar4 * dVar5) * -0.2132 + dVar1 * 0.0921 * 0.5 + 0.15185;
  T[0xc] = 0.0;
  T[0xd] = 0.0;
  T[0xe] = 0.0;
  T[0xf] = 1.0;
  return;
}

Assistant:

void forward(const double* q, double* T) {
    double s1 = sin(*q), c1 = cos(*q); q++;
    double q234 = *q, s2 = sin(*q), c2 = cos(*q); q++;
    double s3 = sin(*q), c3 = cos(*q); q234 += *q; q++;
    q234 += *q; q++;
    double s5 = sin(*q), c5 = cos(*q); q++;
    double s6 = sin(*q), c6 = cos(*q);
    double s234 = sin(q234), c234 = cos(q234);
    *T = ((c1*c234-s1*s234)*s5)/2.0 - c5*s1 + ((c1*c234+s1*s234)*s5)/2.0; T++;
    *T = (c6*(s1*s5 + ((c1*c234-s1*s234)*c5)/2.0 + ((c1*c234+s1*s234)*c5)/2.0) -
          (s6*((s1*c234+c1*s234) - (s1*c234-c1*s234)))/2.0); T++;
    *T = (-(c6*((s1*c234+c1*s234) - (s1*c234-c1*s234)))/2.0 -
          s6*(s1*s5 + ((c1*c234-s1*s234)*c5)/2.0 + ((c1*c234+s1*s234)*c5)/2.0)); T++;
    *T = ((d5*(s1*c234-c1*s234))/2.0 - (d5*(s1*c234+c1*s234))/2.0 -
          d4*s1 + (d6*(c1*c234-s1*s234)*s5)/2.0 + (d6*(c1*c234+s1*s234)*s5)/2.0 -
          a2*c1*c2 - d6*c5*s1 - a3*c1*c2*c3 + a3*c1*s2*s3); T++;
    *T = c1*c5 + ((s1*c234+c1*s234)*s5)/2.0 + ((s1*c234-c1*s234)*s5)/2.0; T++;
    *T = (c6*(((s1*c234+c1*s234)*c5)/2.0 - c1*s5 + ((s1*c234-c1*s234)*c5)/2.0) +
          s6*((c1*c234-s1*s234)/2.0 - (c1*c234+s1*s234)/2.0)); T++;
    *T = (c6*((c1*c234-s1*s234)/2.0 - (c1*c234+s1*s234)/2.0) -
          s6*(((s1*c234+c1*s234)*c5)/2.0 - c1*s5 + ((s1*c234-c1*s234)*c5)/2.0)); T++;
    *T = ((d5*(c1*c234-s1*s234))/2.0 - (d5*(c1*c234+s1*s234))/2.0 + d4*c1 +
          (d6*(s1*c234+c1*s234)*s5)/2.0 + (d6*(s1*c234-c1*s234)*s5)/2.0 + d6*c1*c5 -
          a2*c2*s1 - a3*c2*c3*s1 + a3*s1*s2*s3); T++;
    *T = ((c234*c5-s234*s5)/2.0 - (c234*c5+s234*s5)/2.0); T++;
    *T = ((s234*c6-c234*s6)/2.0 - (s234*c6+c234*s6)/2.0 - s234*c5*c6); T++;
    *T = (s234*c5*s6 - (c234*c6+s234*s6)/2.0 - (c234*c6-s234*s6)/2.0); T++;
    *T = (d1 + (d6*(c234*c5-s234*s5))/2.0 + a3*(s2*c3+c2*s3) + a2*s2 -
         (d6*(c234*c5+s234*s5))/2.0 - d5*c234); T++;
    *T = 0.0; T++; *T = 0.0; T++; *T = 0.0; T++; *T = 1.0;
  }